

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::ui_render_main(Application *this)

{
  shared_ptr<PathTracerThread> *path_tracer_thread;
  
  if (this->m_ui_state == kLoading) {
    ImGui::OpenPopup("Loading",0);
    UI::LoaderLoadingModal(&this->m_loader_thread);
  }
  ui_menubar(this);
  UI::LoaderLoadSceneModal(&this->m_loader_thread);
  path_tracer_thread = &this->m_path_tracer_thread;
  UI::PathTracerStartModal(path_tracer_thread);
  UI::PathTracerStopModal(path_tracer_thread);
  UI::PathTracerExportEXRModal(path_tracer_thread);
  UI::LightingLoadEnvMapModal(&this->m_main_command_pool,&this->m_lighting);
  return;
}

Assistant:

void Application::ui_render_main() {
	if (m_ui_state == UIStates::kLoading) {
		ImGui::OpenPopup(UI::kLoaderLoadingModal);
		UI::LoaderLoadingModal(m_loader_thread);
	}
	ui_menubar();

	UI::LoaderLoadSceneModal(m_loader_thread);
	UI::PathTracerStartModal(m_path_tracer_thread);
	UI::PathTracerStopModal(m_path_tracer_thread);
	UI::PathTracerExportEXRModal(m_path_tracer_thread);
	UI::LightingLoadEnvMapModal(m_main_command_pool, m_lighting);
}